

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O1

void free_variable_decl(gvisitor_t *self,gnode_variable_decl_t *node)

{
  uint32_t uVar1;
  size_t sVar2;
  gnode_t **__ptr;
  gnode_var_t *p;
  ulong uVar3;
  
  uVar1 = (node->base).refcount;
  if (uVar1 != 0) {
    (node->base).refcount = uVar1 - 1;
    return;
  }
  if (node->decls != (gnode_r *)0x0) {
    sVar2 = node->decls->n;
    if (sVar2 != 0) {
      uVar3 = 0;
      do {
        if (uVar3 < node->decls->n) {
          p = (gnode_var_t *)node->decls->p[uVar3];
        }
        else {
          p = (gnode_var_t *)0x0;
        }
        free_variable(self,p);
        uVar3 = uVar3 + 1;
      } while (sVar2 != uVar3);
    }
    __ptr = node->decls->p;
    if (__ptr != (gnode_t **)0x0) {
      free(__ptr);
    }
    free(node->decls);
  }
  free(node);
  return;
}

Assistant:

static void free_variable_decl (gvisitor_t *self, gnode_variable_decl_t *node) {
    CHECK_REFCOUNT(node);
    if (node->decls) {
        gnode_array_each(node->decls, {free_variable(self, (gnode_var_t *)val);});
        gnode_array_free(node->decls);
    }
    mem_free((gnode_t*)node);
}